

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  ZSTD_optimal_t *pZVar1;
  BYTE *pBVar2;
  ZSTD_OptPrice_e ZVar3;
  ZSTD_optimal_t *pZVar4;
  undefined8 uVar5;
  seqDef *psVar6;
  U32 UVar7;
  U32 UVar8;
  U32 UVar9;
  U32 UVar10;
  optState_t *poVar11;
  ZSTD_match_t *pZVar12;
  seqStore_t *psVar13;
  U32 UVar14;
  int iVar15;
  uint uVar16;
  U32 UVar17;
  U32 UVar18;
  int iVar19;
  undefined4 extraout_var;
  U32 *pUVar20;
  ZSTD_OptPrice_e optLevel;
  BYTE *pBVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  rawSeqStore_t *prVar27;
  uint uVar28;
  uint uVar29;
  U32 storePos;
  int iVar30;
  ZSTD_optimal_t *pZVar31;
  uint uVar32;
  uint uVar33;
  BYTE *pBVar34;
  U32 nbMatches;
  U32 UStack_17c;
  U32 local_178 [2];
  U32 *local_170;
  U32 local_168;
  uint local_164;
  BYTE *local_160;
  ulong local_158;
  BYTE *local_150;
  U32 local_144;
  BYTE *local_140;
  U32 *local_138;
  BYTE *local_130;
  uint local_124;
  BYTE *local_120;
  optState_t *local_118;
  undefined8 local_110;
  U32 local_108;
  ulong local_100;
  ZSTD_match_t *local_f8;
  U32 nextToUpdate3;
  U32 *local_e8;
  ulong local_e0;
  U32 *local_d8;
  ulong local_d0;
  U32 local_c4;
  ulong local_c0;
  ulong local_b8;
  void *local_b0;
  code *local_a8;
  BYTE *local_a0;
  seqStore_t *local_98;
  undefined8 local_90;
  U32 local_88;
  ulong local_80;
  U32 *local_78;
  BYTE *local_70;
  ZSTD_optLdm_t optLdm;
  
  uVar25 = (ms->cParams).minMatch;
  local_170 = (U32 *)((ms->window).base + (ms->window).dictLimit);
  local_d8 = (U32 *)CONCAT71(local_d8._1_7_,uVar25 - 3 != 0);
  uVar24 = (ulong)(uVar25 - 3);
  if (uVar25 - 6 < 0xfffffffd) {
    uVar24 = (ulong)(2 < uVar25) * 3;
  }
  local_a8 = (code *)(&PTR_ZSTD_btGetAllMatches_noDict_3_024bd8e0)[(ulong)dictMode * 4 + uVar24];
  uVar25 = (ms->cParams).targetLength;
  local_124 = 0xfff;
  if (uVar25 < 0xfff) {
    local_124 = uVar25;
  }
  nextToUpdate3 = ms->nextToUpdate;
  local_f8 = (ms->opt).matchTable;
  pZVar4 = (ms->opt).priceTable;
  local_110 = 0;
  local_108 = 0;
  prVar27 = (rawSeqStore_t *)kNullRawSeqStore;
  if (ms->ldmSeqStore != (rawSeqStore_t *)0x0) {
    prVar27 = ms->ldmSeqStore;
  }
  optLdm.seqStore.capacity = prVar27->capacity;
  optLdm.seqStore.seq = prVar27->seq;
  optLdm.seqStore.pos = prVar27->pos;
  optLdm.seqStore.posInSequence = prVar27->posInSequence;
  optLdm.seqStore.size = prVar27->size;
  optLdm.offset = 0;
  local_d0 = 0;
  optLdm.startPosInBlock = 0;
  optLdm.endPosInBlock = 0;
  local_120 = (BYTE *)((long)src + srcSize);
  pBVar34 = (BYTE *)((long)src + (srcSize - 8));
  local_e8 = rep;
  local_98 = seqStore;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&optLdm,0,(U32)srcSize);
  local_118 = &ms->opt;
  ZSTD_rescaleFreqs(&ms->opt,(BYTE *)src,srcSize,2);
  pBVar21 = (BYTE *)((ulong)(local_170 == (U32 *)src) + (long)src);
  local_140 = (BYTE *)src;
  if (pBVar21 < pBVar34) {
    local_158 = (ulong)((byte)local_d8 + 3);
    local_78 = pZVar4->rep;
    local_70 = local_120 + -0x20;
    local_170 = &pZVar4[1].litlen;
    local_100 = 0;
    local_164 = 0;
    local_144 = 0;
    local_d8 = local_170;
    local_b0 = src;
    local_a0 = pBVar34;
    local_80 = local_158;
    do {
      pUVar20 = local_e8;
      pZVar12 = local_f8;
      pBVar34 = local_120;
      iVar15 = (int)pBVar21;
      local_160 = (BYTE *)CONCAT44(local_160._4_4_,iVar15 - (int)local_140);
      nbMatches = (*local_a8)(local_f8,ms,&nextToUpdate3,pBVar21,local_120,local_e8,
                              iVar15 - (int)local_140 == 0,local_158);
      ZSTD_optLdm_processMatchCandidate
                (&optLdm,pZVar12,&nbMatches,iVar15 - (int)local_b0,(int)pBVar34 - iVar15);
      UVar17 = nbMatches;
      if (nbMatches == 0) {
        local_130 = pBVar21 + 1;
        uVar24 = 0;
        iVar15 = 4;
      }
      else {
        pZVar4->mlen = 0;
        UVar18 = (U32)local_160;
        pZVar4->litlen = (U32)local_160;
        local_130 = pBVar21;
        UVar14 = ZSTD_litLengthPrice((U32)local_160,local_118,2);
        pZVar4->price = UVar14;
        local_78[2] = pUVar20[2];
        *(undefined8 *)local_78 = *(undefined8 *)pUVar20;
        uVar25 = local_f8[UVar17 - 1].len;
        if (local_124 < uVar25) {
          local_100 = (ulong)local_f8[UVar17 - 1].off;
          local_170 = (U32 *)0x0;
          iVar15 = 0xc;
          uVar24 = (ulong)uVar25;
          local_144 = 0;
          local_164 = uVar25;
        }
        else {
          uVar23 = 1;
          pUVar20 = local_d8;
          do {
            ((ZSTD_optimal_t *)(pUVar20 + -3))->price = 0x40000000;
            pUVar20[-1] = 0;
            *pUVar20 = UVar18 + (int)uVar23;
            uVar23 = uVar23 + 1;
            pUVar20 = pUVar20 + 7;
          } while (local_80 != uVar23);
          local_160 = (BYTE *)(ulong)(UVar17 + (UVar17 == 0));
          pBVar21 = (BYTE *)0x0;
          do {
            uVar25 = local_f8[(long)pBVar21].len;
            if ((uint)uVar23 <= uVar25) {
              uVar16 = local_f8[(long)pBVar21].off;
              uVar28 = 0x1f;
              if (uVar16 != 0) {
                for (; uVar16 >> uVar28 == 0; uVar28 = uVar28 - 1) {
                }
              }
              ZVar3 = (ms->opt).priceType;
              uVar29 = (uint)uVar23 * 0x100 - 0x200;
              do {
                UVar17 = (U32)uVar23;
                if (ZVar3 == zop_predef) {
                  iVar15 = 0x1f;
                  if (UVar17 - 2 != 0) {
                    for (; UVar17 - 2 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                    }
                  }
                  iVar15 = (uVar29 >> ((byte)iVar15 & 0x1f)) + (iVar15 + uVar28) * 0x100 + 0x1000;
                }
                else {
                  uVar33 = UVar17 - 3;
                  uVar32 = (ms->opt).offCodeFreq[uVar28] + 1;
                  iVar15 = 0x1f;
                  if (uVar32 != 0) {
                    for (; uVar32 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                    }
                  }
                  if (uVar33 < 0x80) {
                    uVar33 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar33];
                  }
                  else {
                    uVar26 = 0x1f;
                    if (uVar33 != 0) {
                      for (; uVar33 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                      }
                    }
                    uVar33 = (uVar26 ^ 0xffffffe0) + 0x44;
                  }
                  uVar26 = (ms->opt).matchLengthFreq[uVar33] + 1;
                  iVar19 = 0x1f;
                  if (uVar26 != 0) {
                    for (; uVar26 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                    }
                  }
                  iVar15 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                           ((uVar32 * 0x100 >> ((byte)iVar15 & 0x1f)) +
                           (uVar26 * 0x100 >> ((byte)iVar19 & 0x1f)))) +
                           (((byte)ML_bits[uVar33] + uVar28) - (iVar15 + iVar19)) * 0x100 + 0x33;
                }
                iVar19 = pZVar4->price;
                uVar23 = uVar23 & 0xffffffff;
                pZVar4[uVar23].mlen = UVar17;
                pZVar4[uVar23].off = uVar16;
                pZVar4[uVar23].litlen = 0;
                iVar30 = 0x100;
                if (ZVar3 != zop_predef) {
                  uVar32 = *(ms->opt).litLengthFreq + 1;
                  iVar30 = 0x1f;
                  if (uVar32 != 0) {
                    for (; uVar32 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                    }
                  }
                  iVar30 = (ms->opt).litLengthSumBasePrice -
                           (iVar30 * 0x100 + (uVar32 * 0x100 >> ((byte)iVar30 & 0x1f)));
                }
                pZVar4[uVar23].price = iVar15 + iVar19 + iVar30;
                uVar23 = (ulong)(UVar17 + 1);
                uVar29 = uVar29 + 0x100;
              } while (UVar17 + 1 <= uVar25);
            }
            pBVar21 = pBVar21 + 1;
          } while (pBVar21 != local_160);
          uVar24 = (ulong)((int)uVar23 - 1);
          pZVar4[uVar23 & 0xffffffff].price = 0x40000000;
          iVar15 = 0;
        }
      }
      if (iVar15 == 0xc) {
LAB_0191571e:
        if (local_164 == 0) {
          local_130 = local_130 + (uVar24 & 0xffffffff);
          local_164 = 0;
        }
        else {
          uVar25 = (uint)local_100;
          if (local_144 == 0) {
            uVar24 = (ulong)local_170 & 0xffffffff;
            local_178[0] = pZVar4[uVar24].rep[2];
            nbMatches = (U32)*(undefined8 *)pZVar4[uVar24].rep;
            UStack_17c = (U32)((ulong)*(undefined8 *)pZVar4[uVar24].rep >> 0x20);
            if (uVar25 < 4) {
              uVar16 = (uVar25 + (pZVar4[uVar24].litlen == 0)) - 1;
              UVar17 = nbMatches;
              UVar18 = UStack_17c;
              if (uVar16 != 0) {
                if (uVar16 == 3) {
                  UVar17 = nbMatches - 1;
                }
                else {
                  UVar17 = (&nbMatches)[uVar16];
                }
                pUVar20 = &UStack_17c;
                if (uVar16 == 1) {
                  pUVar20 = local_178;
                }
                local_178[0] = *pUVar20;
                UStack_17c = nbMatches;
                UVar18 = UStack_17c;
              }
            }
            else {
              UVar17 = uVar25 - 3;
              UVar18 = nbMatches;
              local_178[0] = UStack_17c;
            }
            UStack_17c = UVar18;
            nbMatches = UVar17;
            *(ulong *)local_e8 = CONCAT44(UStack_17c,nbMatches);
            local_e8[2] = local_178[0];
          }
          else {
            local_e8[2] = local_108;
            *(undefined8 *)local_e8 = local_110;
            local_170 = (U32 *)(ulong)((int)local_170 - local_144);
          }
          local_168 = (int)local_170 + 2;
          if (local_144 != 0) {
            pZVar4[local_168].litlen = local_144;
            pZVar4[local_168].mlen = 0;
            uVar16 = (int)local_170 + 1;
            pZVar4[uVar16].price = (int)local_d0;
            pZVar4[uVar16].off = uVar25;
            pZVar4[uVar16].mlen = local_164;
            pZVar4[uVar16].litlen = local_144;
            *(undefined8 *)pZVar4[uVar16].rep = local_110;
            pZVar4[uVar16].rep[2] = local_108;
          }
          pZVar4[local_168].price = (int)local_d0;
          pZVar4[local_168].off = uVar25;
          pZVar4[local_168].mlen = local_164;
          pZVar4[local_168].litlen = local_144;
          *(undefined8 *)pZVar4[local_168].rep = local_110;
          pZVar4[local_168].rep[2] = local_108;
          uVar23 = (ulong)local_168;
          uVar24 = (ulong)local_170 & 0xffffffff;
          while( true ) {
            iVar15 = pZVar4[uVar24].price;
            UVar14 = pZVar4[uVar24].off;
            UVar17 = pZVar4[uVar24].mlen;
            UVar18 = pZVar4[uVar24].litlen;
            pZVar4[uVar23].litlen = UVar18;
            pBVar21 = local_130;
            pBVar34 = local_140;
            if (UVar17 == 0) break;
            uVar23 = (ulong)((int)uVar23 - 1);
            pZVar4[uVar23].price = iVar15;
            pZVar4[uVar23].off = UVar14;
            pZVar4[uVar23].mlen = UVar17;
            pZVar4[uVar23].litlen = UVar18;
            uVar5 = *(undefined8 *)pZVar4[uVar24].rep;
            pZVar4[uVar23].rep[2] = pZVar4[uVar24].rep[2];
            *(undefined8 *)pZVar4[uVar23].rep = uVar5;
            uVar24 = (ulong)((int)uVar24 - (UVar18 + UVar17));
          }
          for (; (uint)uVar23 <= local_168; uVar23 = (ulong)((uint)uVar23 + 1)) {
            uVar25 = pZVar4[uVar23].mlen;
            uVar16 = pZVar4[uVar23].litlen;
            if ((ulong)uVar25 == 0) {
              pBVar21 = pBVar34 + uVar16;
            }
            else {
              local_160 = (BYTE *)(ulong)uVar25;
              local_150 = (BYTE *)CONCAT44(local_150._4_4_,pZVar4[uVar23].off);
              ZSTD_updateStats(local_118,uVar16,pBVar34,pZVar4[uVar23].off,uVar25);
              psVar13 = local_98;
              if (local_70 < pBVar34 + uVar16) {
                local_140 = pBVar34;
                ZSTD_safecopyLiterals(local_98->lit,pBVar34,pBVar34 + uVar16,local_70);
                pBVar34 = local_140;
              }
              else {
                pBVar21 = local_98->lit;
                uVar5 = *(undefined8 *)(pBVar34 + 8);
                *(undefined8 *)pBVar21 = *(undefined8 *)pBVar34;
                *(undefined8 *)(pBVar21 + 8) = uVar5;
                if (0x10 < uVar16) {
                  pBVar21 = local_98->lit;
                  uVar5 = *(undefined8 *)(pBVar34 + 0x18);
                  *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar34 + 0x10);
                  *(undefined8 *)(pBVar21 + 0x18) = uVar5;
                  if (0x20 < uVar16) {
                    lVar22 = 0;
                    do {
                      uVar5 = *(undefined8 *)(pBVar34 + lVar22 + 0x20 + 8);
                      pBVar2 = pBVar21 + lVar22 + 0x20;
                      *(undefined8 *)pBVar2 = *(undefined8 *)(pBVar34 + lVar22 + 0x20);
                      *(undefined8 *)(pBVar2 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(pBVar34 + lVar22 + 0x30 + 8);
                      *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(pBVar34 + lVar22 + 0x30);
                      *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                      lVar22 = lVar22 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar16);
                  }
                }
              }
              psVar13->lit = psVar13->lit + uVar16;
              if (0xffff < uVar16) {
                psVar13->longLengthType = ZSTD_llt_literalLength;
                psVar13->longLengthPos =
                     (U32)((ulong)((long)psVar13->sequences - (long)psVar13->sequencesStart) >> 3);
              }
              psVar6 = psVar13->sequences;
              psVar6->litLength = (U16)uVar16;
              psVar6->offBase = (U32)local_150;
              uVar24 = (ulong)uVar25 - 3;
              if (0xffff < uVar24) {
                psVar13->longLengthType = ZSTD_llt_matchLength;
                psVar13->longLengthPos =
                     (U32)((ulong)((long)psVar6 - (long)psVar13->sequencesStart) >> 3);
              }
              psVar6->mlBase = (U16)uVar24;
              psVar13->sequences = psVar6 + 1;
              pBVar21 = pBVar34 + ((int)local_160 + uVar16);
              pBVar34 = pBVar21;
            }
          }
          local_140 = pBVar34;
          local_130 = pBVar21;
          ZSTD_setBasePrices(local_118,2);
        }
      }
      else if (iVar15 == 0) {
        if ((int)uVar24 != 0) {
          local_170 = (U32 *)&DAT_00000001;
          do {
            poVar11 = local_118;
            local_150 = local_130 + (long)local_170;
            uVar16 = (int)local_170 - 1;
            local_168 = pZVar4[uVar16].price;
            local_e0 = (ulong)pZVar4[uVar16].litlen;
            local_160 = (BYTE *)CONCAT44(local_160._4_4_,pZVar4[uVar16].litlen + 1);
            local_138 = local_170;
            UVar17 = ZSTD_rawLiteralsCost
                               (local_130 + -1 + (long)local_170,(U32)local_118,(optState_t *)0x2,
                                uVar16 * 9);
            iVar15 = UVar17 + local_168;
            local_168 = ZSTD_litLengthPrice((U32)local_160,poVar11,2);
            UVar17 = ZSTD_litLengthPrice((U32)local_e0,poVar11,2);
            UVar17 = (local_168 - UVar17) + iVar15;
            pZVar1 = pZVar4 + (long)local_138;
            uVar25 = pZVar4[(long)local_138].price;
            if ((int)UVar17 <= (int)uVar25) {
              pZVar31 = pZVar4 + uVar16;
              uVar16 = pZVar1->off;
              UVar18 = pZVar1->mlen;
              UVar14 = pZVar1->litlen;
              local_88 = pZVar1->rep[2];
              local_90 = *(undefined8 *)pZVar1->rep;
              iVar15 = pZVar31->price;
              UVar8 = pZVar31->off;
              UVar9 = pZVar31->mlen;
              UVar10 = pZVar31->litlen;
              UVar7 = pZVar31->rep[0];
              uVar5 = *(undefined8 *)(pZVar31->rep + 1);
              pZVar1->litlen = pZVar31->litlen;
              pZVar1->rep[0] = UVar7;
              *(undefined8 *)(pZVar1->rep + 1) = uVar5;
              pZVar1->price = iVar15;
              pZVar1->off = UVar8;
              pZVar1->mlen = UVar9;
              pZVar1->litlen = UVar10;
              pZVar1->litlen = (U32)local_160;
              pZVar1->price = UVar17;
              if (UVar14 == 0) {
                local_168 = UVar17;
                ZVar3 = (ms->opt).priceType;
                iVar15 = 0x200;
                local_138 = (U32 *)CONCAT44(local_138._4_4_,ZVar3);
                optLevel = ZVar3;
                if (ZVar3 != zop_predef) {
                  uVar28 = (ms->opt).litLengthFreq[1] + 1;
                  iVar15 = 0x1f;
                  if (uVar28 != 0) {
                    for (; uVar28 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                    }
                  }
                  optLevel = iVar15 * 0x100 + (uVar28 * 0x100 >> ((byte)iVar15 & 0x1f));
                  iVar15 = (ms->opt).litLengthSumBasePrice - optLevel;
                }
                iVar19 = 0x100;
                if (ZVar3 != zop_predef) {
                  uVar28 = *(ms->opt).litLengthFreq + 1;
                  iVar19 = 0x1f;
                  if (uVar28 != 0) {
                    for (; uVar28 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                    }
                  }
                  optLevel = iVar19 * 0x100 + (uVar28 * 0x100 >> ((byte)iVar19 & 0x1f));
                  iVar19 = (ms->opt).litLengthSumBasePrice - optLevel;
                }
                if ((iVar15 < iVar19) && (local_150 < local_120)) {
                  local_c4 = UVar18;
                  local_b8 = (ulong)uVar16;
                  UVar17 = ZSTD_rawLiteralsCost(local_150,(U32)local_118,(optState_t *)0x2,optLevel)
                  ;
                  poVar11 = local_118;
                  iVar15 = 0x200;
                  if ((int)local_138 != 1) {
                    uVar16 = (ms->opt).litLengthFreq[1] + 1;
                    iVar15 = 0x1f;
                    if (uVar16 != 0) {
                      for (; uVar16 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                      }
                    }
                    iVar15 = (ms->opt).litLengthSumBasePrice -
                             (iVar15 * 0x100 + (uVar16 * 0x100 >> ((byte)iVar15 & 0x1f)));
                  }
                  iVar19 = -0x100;
                  if ((int)local_138 != 1) {
                    uVar16 = *(ms->opt).litLengthFreq + 1;
                    iVar19 = 0x1f;
                    if (uVar16 != 0) {
                      for (; uVar16 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                      }
                    }
                    iVar19 = (iVar19 * 0x100 + (uVar16 * 0x100 >> ((byte)iVar19 & 0x1f))) -
                             (ms->opt).litLengthSumBasePrice;
                  }
                  local_138 = (U32 *)CONCAT44(local_138._4_4_,iVar19 + iVar15 + UVar17 + uVar25);
                  iVar15 = (int)local_e0;
                  local_e0 = CONCAT44(extraout_var,UVar17);
                  local_c0 = (ulong)uVar25;
                  UVar17 = ZSTD_litLengthPrice(iVar15 + 2,local_118,2);
                  UVar18 = ZSTD_litLengthPrice((U32)local_160,poVar11,2);
                  if ((int)local_138 < (int)((local_168 + (int)local_e0 + UVar17) - UVar18)) {
                    uVar25 = (int)local_170 + 1;
                    if ((int)local_138 < pZVar4[uVar25].price) {
                      uVar16 = (int)local_170 - local_c4;
                      local_178[0] = pZVar4[uVar16].rep[2];
                      nbMatches = (U32)*(undefined8 *)pZVar4[uVar16].rep;
                      UStack_17c = (U32)((ulong)*(undefined8 *)pZVar4[uVar16].rep >> 0x20);
                      uVar28 = (uint)local_b8;
                      if (uVar28 < 4) {
                        uVar16 = (uVar28 + (pZVar4[uVar16].litlen == 0)) - 1;
                        UVar17 = nbMatches;
                        UVar18 = UStack_17c;
                        if (uVar16 != 0) {
                          if (uVar16 == 3) {
                            UVar17 = nbMatches - 1;
                          }
                          else {
                            UVar17 = (&nbMatches)[uVar16];
                          }
                          pUVar20 = &UStack_17c;
                          if (uVar16 == 1) {
                            pUVar20 = local_178;
                          }
                          local_178[0] = *pUVar20;
                          UStack_17c = nbMatches;
                          UVar18 = UStack_17c;
                        }
                      }
                      else {
                        UVar17 = uVar28 - 3;
                        UVar18 = nbMatches;
                        local_178[0] = UStack_17c;
                      }
                      UStack_17c = UVar18;
                      nbMatches = UVar17;
                      pZVar31 = pZVar4 + uVar25;
                      pZVar31->price = (int)local_c0;
                      pZVar31->off = uVar28;
                      pZVar31->mlen = local_c4;
                      pZVar31->litlen = 0;
                      *(undefined8 *)pZVar31->rep = local_90;
                      pZVar31->rep[2] = local_88;
                      *(ulong *)pZVar31->rep = CONCAT44(UStack_17c,nbMatches);
                      pZVar31->rep[2] = local_178[0];
                      pZVar31->litlen = 1;
                      pZVar31->price = (int)local_138;
                      if (uVar25 < (uint)uVar24) {
                        uVar25 = (uint)uVar24;
                      }
                      uVar24 = (ulong)uVar25;
                    }
                  }
                }
              }
            }
            pZVar12 = local_f8;
            pBVar21 = local_120;
            if (pZVar1->litlen == 0) {
              uVar16 = (int)local_170 - pZVar1->mlen;
              uVar25 = pZVar1->off;
              local_178[0] = pZVar4[uVar16].rep[2];
              nbMatches = (U32)*(undefined8 *)pZVar4[uVar16].rep;
              UStack_17c = (U32)((ulong)*(undefined8 *)pZVar4[uVar16].rep >> 0x20);
              if (uVar25 < 4) {
                uVar25 = (uVar25 + (pZVar4[uVar16].litlen == 0)) - 1;
                UVar17 = nbMatches;
                UVar18 = UStack_17c;
                if (uVar25 != 0) {
                  if (uVar25 == 3) {
                    UVar17 = nbMatches - 1;
                  }
                  else {
                    UVar17 = (&nbMatches)[uVar25];
                  }
                  pUVar20 = &UStack_17c;
                  if (uVar25 == 1) {
                    pUVar20 = local_178;
                  }
                  local_178[0] = *pUVar20;
                  UStack_17c = nbMatches;
                  UVar18 = UStack_17c;
                }
              }
              else {
                UVar17 = uVar25 - 3;
                UVar18 = nbMatches;
                local_178[0] = UStack_17c;
              }
              UStack_17c = UVar18;
              nbMatches = UVar17;
              *(ulong *)pZVar1->rep = CONCAT44(UStack_17c,nbMatches);
              pZVar1->rep[2] = local_178[0];
            }
            uVar25 = 0x1a;
            if ((local_150 <= local_a0) && (uVar25 = 0x18, (int)local_170 != (int)uVar24)) {
              iVar15 = 0x100;
              if ((ms->opt).priceType != zop_predef) {
                uVar25 = *(ms->opt).litLengthFreq + 1;
                iVar15 = 0x1f;
                if (uVar25 != 0) {
                  for (; uVar25 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                  }
                }
                iVar15 = (ms->opt).litLengthSumBasePrice -
                         (iVar15 * 0x100 + (uVar25 * 0x100 >> ((byte)iVar15 & 0x1f)));
              }
              local_160 = (BYTE *)CONCAT44(local_160._4_4_,pZVar1->price);
              nbMatches = (*local_a8)(local_f8,ms,&nextToUpdate3,local_150,local_120,pZVar1->rep,
                                      pZVar1->litlen == 0,local_158);
              pBVar34 = local_150;
              ZSTD_optLdm_processMatchCandidate
                        (&optLdm,pZVar12,&nbMatches,(int)local_150 - (int)local_b0,
                         (int)pBVar21 - (int)local_150);
              if (nbMatches == 0) {
                uVar25 = 0x1a;
              }
              else {
                uVar16 = pZVar12[nbMatches - 1].len;
                uVar28 = uVar16 + (int)local_170;
                if ((uVar28 < 0x1000 && uVar16 <= local_124) && pBVar34 + uVar16 < local_120) {
                  iVar15 = iVar15 + (U32)local_160;
                  local_150 = (BYTE *)(ulong)(nbMatches + (nbMatches == 0));
                  pBVar21 = (BYTE *)0x0;
                  do {
                    uVar25 = (uint)local_158;
                    if (pBVar21 != (BYTE *)0x0) {
                      uVar25 = local_f8[(long)(pBVar21 + -1)].len + 1;
                    }
                    uVar16 = local_f8[(long)pBVar21].len;
                    local_160 = pBVar21;
                    if (uVar25 <= uVar16) {
                      uVar28 = local_f8[(long)pBVar21].off;
                      uVar29 = 0x1f;
                      if (uVar28 != 0) {
                        for (; uVar28 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                        }
                      }
                      ZVar3 = (ms->opt).priceType;
                      do {
                        if (ZVar3 == zop_predef) {
                          uVar32 = uVar16 - 2;
                          iVar19 = 0x1f;
                          if (uVar32 != 0) {
                            for (; uVar32 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                            }
                          }
                          iVar19 = (uVar32 * 0x100 >> ((byte)iVar19 & 0x1f)) +
                                   (iVar19 + uVar29) * 0x100 + 0x1000;
                        }
                        else {
                          uVar32 = uVar16 - 3;
                          uVar33 = (ms->opt).offCodeFreq[uVar29] + 1;
                          iVar19 = 0x1f;
                          if (uVar33 != 0) {
                            for (; uVar33 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                            }
                          }
                          if (uVar32 < 0x80) {
                            uVar32 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar32];
                          }
                          else {
                            uVar26 = 0x1f;
                            if (uVar32 != 0) {
                              for (; uVar32 >> uVar26 == 0; uVar26 = uVar26 - 1) {
                              }
                            }
                            uVar32 = (uVar26 ^ 0xffffffe0) + 0x44;
                          }
                          uVar26 = (ms->opt).matchLengthFreq[uVar32] + 1;
                          iVar30 = 0x1f;
                          if (uVar26 != 0) {
                            for (; uVar26 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                            }
                          }
                          iVar19 = (((byte)ML_bits[uVar32] + uVar29) - (iVar19 + iVar30)) * 0x100 +
                                   (((ms->opt).offCodeSumBasePrice +
                                    (ms->opt).matchLengthSumBasePrice) -
                                   ((uVar33 * 0x100 >> ((byte)iVar19 & 0x1f)) +
                                   (uVar26 * 0x100 >> ((byte)iVar30 & 0x1f)))) + 0x33;
                        }
                        iVar19 = iVar19 + iVar15;
                        uVar32 = uVar16 + (int)local_170;
                        uVar23 = (ulong)uVar32;
                        if (((uint)uVar24 < uVar32) || (iVar19 < pZVar4[uVar23].price)) {
                          if ((uint)uVar24 < uVar32) {
                            uVar24 = uVar24 & 0xffffffff;
                            pUVar20 = local_d8 + uVar24 * 7;
                            do {
                              uVar24 = uVar24 + 1;
                              ((ZSTD_optimal_t *)(pUVar20 + -3))->price = 0x40000000;
                              *pUVar20 = 1;
                              pUVar20 = pUVar20 + 7;
                            } while (uVar24 < uVar23);
                          }
                          pZVar4[uVar23].mlen = uVar16;
                          pZVar4[uVar23].off = uVar28;
                          pZVar4[uVar23].litlen = 0;
                          pZVar4[uVar23].price = iVar19;
                        }
                        uVar16 = uVar16 - 1;
                      } while (uVar25 <= uVar16);
                    }
                    pBVar21 = pBVar21 + 1;
                  } while (pBVar21 != local_150);
                  uVar25 = 0;
                }
                else {
                  local_100 = (ulong)pZVar12[nbMatches - 1].off;
                  local_144 = 0;
                  uVar25 = 0xc;
                  uVar24 = (ulong)uVar28;
                  local_164 = uVar16;
                }
              }
              if (uVar25 == 0) {
                pZVar4[(int)uVar24 + 1].price = 0x40000000;
                uVar25 = 0;
              }
            }
            if (uVar25 < 0x18) {
              if (uVar25 != 0) {
                if (uVar25 != 0xc) goto LAB_01915acf;
                goto LAB_0191571e;
              }
            }
            else if (uVar25 != 0x1a) {
              if (uVar25 != 0x18) goto LAB_01915acf;
              break;
            }
            uVar25 = (int)local_170 + 1;
            local_170 = (U32 *)(ulong)uVar25;
          } while (uVar25 <= (uint)uVar24);
        }
        uVar23 = uVar24 & 0xffffffff;
        local_d0 = (ulong)(uint)pZVar4[uVar23].price;
        local_100 = (ulong)pZVar4[uVar23].off;
        local_164 = pZVar4[uVar23].mlen;
        local_144 = pZVar4[uVar23].litlen;
        local_108 = pZVar4[uVar23].rep[2];
        local_110 = *(undefined8 *)pZVar4[uVar23].rep;
        local_170 = (U32 *)(ulong)((int)uVar24 - local_164);
        goto LAB_0191571e;
      }
LAB_01915acf:
      pBVar21 = local_130;
    } while (local_130 < local_a0);
  }
  return (long)local_120 - (long)local_140;
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}